

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void ClipperLib::SwapIntersectNodes(IntersectNode *int1,IntersectNode *int2)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  long64 lVar3;
  long64 lVar4;
  long64 lVar5;
  IntPoint p;
  
  pTVar1 = int1->edge1;
  pTVar2 = int1->edge2;
  lVar3 = (int1->pt).X;
  lVar4 = (int1->pt).Y;
  int1->edge1 = int2->edge1;
  int1->edge2 = int2->edge2;
  lVar5 = (int2->pt).Y;
  (int1->pt).X = (int2->pt).X;
  (int1->pt).Y = lVar5;
  int2->edge1 = pTVar1;
  int2->edge2 = pTVar2;
  (int2->pt).X = lVar3;
  (int2->pt).Y = lVar4;
  return;
}

Assistant:

void SwapIntersectNodes(IntersectNode &int1, IntersectNode &int2)
{
  TEdge *e1 = int1.edge1;
  TEdge *e2 = int1.edge2;
  IntPoint p = int1.pt;

  int1.edge1 = int2.edge1;
  int1.edge2 = int2.edge2;
  int1.pt = int2.pt;

  int2.edge1 = e1;
  int2.edge2 = e2;
  int2.pt = p;
}